

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O2

index __thiscall
boost::detail::multi_array::
multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,3ul>
::
calculate_origin_offset<boost::array<long,3ul>,boost::array<unsigned_long,3ul>,boost::array<long,3ul>>
          (multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,3ul>
           *this,array<long,_3UL> *stride_list,array<unsigned_long,_3UL> *extent_list,
          general_storage_order<3UL> *storage,array<long,_3UL> *index_base_list)

{
  index iVar1;
  index iVar2;
  
  iVar1 = calculate_descending_dimension_offset<boost::array<long,3ul>,boost::array<unsigned_long,3ul>>
                    (this,stride_list,extent_list,storage);
  iVar2 = calculate_indexing_offset<boost::array<long,3ul>,boost::array<long,3ul>>
                    (this,stride_list,index_base_list);
  return iVar2 + iVar1;
}

Assistant:

index
  calculate_origin_offset(const StrideList& stride_list,
                          const ExtentList& extent_list,
                          const general_storage_order<NumDims>& storage,
                          const BaseList& index_base_list)
  {
    return
      calculate_descending_dimension_offset(stride_list,extent_list,
                                            storage) +
      calculate_indexing_offset(stride_list,index_base_list);
  }